

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O2

RunElement * __thiscall
duckdb::
MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
::StartGames(RunElement *__return_storage_ptr__,
            MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
            *this,Games *losers,RunElements *elements,RunElement *sentinel)

{
  undefined8 *puVar1;
  unsigned_long uVar2;
  undefined8 uVar3;
  long lVar4;
  bool bVar5;
  RunElement *pRVar6;
  RunElement *pRVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RunElement *pRVar11;
  long lVar12;
  Games winners;
  CompareElements *local_328;
  RunElement *local_320;
  RunElement local_318 [31];
  
  local_320 = __return_storage_ptr__;
  switchD_016d4fed::default(local_318,0,0x2e8);
  local_328 = (CompareElements *)&this->field_0x18;
  for (lVar9 = 0x178; lVar9 != 0x2f8; lVar9 = lVar9 + 0x18) {
    pRVar11 = (RunElement *)((long)elements + 0x18);
    bVar5 = CompareElements::operator()(local_328,elements->_M_elems,pRVar11);
    pRVar6 = pRVar11;
    pRVar7 = elements->_M_elems;
    if (!bVar5) {
      pRVar6 = elements->_M_elems;
      pRVar7 = pRVar11;
    }
    *(unsigned_long *)((long)losers->_M_elems + lVar9 + -8) =
         (pRVar6->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
         super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    *(unsigned_long *)((long)losers->_M_elems + lVar9 + -0x10) =
         (pRVar6->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
         super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
         _M_head_impl;
    *(unsigned_long *)
     ((long)&losers->_M_elems[0].first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
             _M_head_impl + lVar9) = pRVar6->second;
    uVar2 = (pRVar7->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
            super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    *(unsigned_long *)((long)&local_328 + lVar9) =
         (pRVar7->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
         super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
         _M_head_impl;
    *(unsigned_long *)((long)&local_320 + lVar9) = uVar2;
    *(unsigned_long *)
     ((long)&local_318[0].first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
             _M_head_impl + lVar9) = pRVar7->second;
    elements = (RunElements *)((long)elements + 0x30);
  }
  lVar9 = 0xb0;
  lVar12 = 0x2d0;
  for (lVar10 = 0x2b8; lVar10 != -0x18; lVar10 = lVar10 + -0x30) {
    pRVar6 = (RunElement *)
             ((long)&local_318[0].first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                     super__Tuple_impl<1UL,_unsigned_long>.
                     super__Head_base<1UL,_unsigned_long,_false>._M_head_impl + lVar10);
    pRVar11 = (RunElement *)
              ((long)&local_318[0].first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                      super__Tuple_impl<1UL,_unsigned_long>.
                      super__Head_base<1UL,_unsigned_long,_false>._M_head_impl + lVar12);
    bVar5 = CompareElements::operator()(local_328,pRVar6,pRVar11);
    lVar8 = lVar12;
    lVar4 = lVar10;
    if (bVar5) {
      lVar8 = lVar10;
      lVar4 = lVar12;
    }
    uVar3 = *(undefined8 *)
             ((long)&local_318[0].first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                     super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + lVar4);
    puVar1 = (undefined8 *)((long)losers->_M_elems + lVar9 * 2 + -0x10);
    *puVar1 = *(undefined8 *)
               ((long)&local_318[0].first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                       super__Tuple_impl<1UL,_unsigned_long>.
                       super__Head_base<1UL,_unsigned_long,_false>._M_head_impl + lVar4);
    puVar1[1] = uVar3;
    pRVar7 = pRVar6;
    if (bVar5) {
      pRVar7 = pRVar11;
    }
    *(unsigned_long *)
     ((long)&losers->_M_elems[0].first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
             _M_head_impl + lVar9 * 2) = pRVar7->second;
    if (bVar5) {
      pRVar11 = pRVar6;
    }
    *(unsigned_long *)((long)&local_320 + lVar9 * 2) =
         (pRVar11->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
         super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    *(undefined8 *)((long)&local_328 + lVar9 * 2) =
         *(undefined8 *)
          ((long)&local_318[0].first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
                  _M_head_impl + lVar8);
    *(unsigned_long *)
     ((long)&local_318[0].first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
             _M_head_impl + lVar9 * 2) = pRVar11->second;
    lVar9 = lVar9 + -0xc;
    lVar12 = lVar12 + -0x30;
  }
  local_320->second = local_318[0].second;
  (local_320->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (unsigned_long)
       local_318[0].first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
       super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
       _M_head_impl;
  (local_320->first).super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       local_318[0].first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
       super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  return local_320;
}

Assistant:

RunElement StartGames(Games &losers, const RunElements &elements, const RunElement &sentinel) {
		const auto elem_nodes = elements.size();
		const auto game_nodes = losers.size();
		Games winners;

		//	Play the first round of games,
		//	placing the losers at the bottom of the game
		const auto base_offset = game_nodes / 2;
		auto losers_base = losers.data() + base_offset;
		auto winners_base = winners.data() + base_offset;

		const auto base_count = elem_nodes / 2;
		for (idx_t i = 0; i < base_count; ++i) {
			const auto &e0 = elements[i * 2 + 0];
			const auto &e1 = elements[i * 2 + 1];
			if (cmp(e0, e1)) {
				losers_base[i] = e1;
				winners_base[i] = e0;
			} else {
				losers_base[i] = e0;
				winners_base[i] = e1;
			}
		}

		//	Fill in any byes
		if (elem_nodes % 2) {
			winners_base[base_count] = elements.back();
			losers_base[base_count] = sentinel;
		}

		//	Pad to a power of 2
		const auto base_size = (game_nodes + 1) / 2;
		for (idx_t i = (elem_nodes + 1) / 2; i < base_size; ++i) {
			winners_base[i] = sentinel;
			losers_base[i] = sentinel;
		}

		//	Play the winners against each other
		//	and stick the losers in the upper levels of the tournament tree
		for (idx_t i = base_offset; i-- > 0;) {
			//	Indexing backwards
			const auto &e0 = winners[i * 2 + 1];
			const auto &e1 = winners[i * 2 + 2];
			if (cmp(e0, e1)) {
				losers[i] = e1;
				winners[i] = e0;
			} else {
				losers[i] = e0;
				winners[i] = e1;
			}
		}

		//	Return the final winner
		return winners[0];
	}